

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O3

void __thiscall QUnixPrintWidgetPrivate::_q_printerChanged(QUnixPrintWidgetPrivate *this,int index)

{
  QPrintDevice *this_00;
  QLabel *pQVar1;
  QPrinter *this_01;
  QPlatformPrintDevice *pQVar2;
  Data *pDVar3;
  int iVar4;
  QPlatformPrinterSupport *pQVar5;
  long in_FS_OFFSET;
  QPrintDevice local_58;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    iVar4 = QComboBox::count();
    QWidget::setEnabled(SUB81((this->widget).super_Ui_QPrintWidget.filename,0));
    QWidget::setEnabled(SUB81((this->widget).super_Ui_QPrintWidget.lOutput,0));
    if (this->propertiesDialog != (QPrintPropertiesDialog *)0x0) {
      (**(code **)(*(long *)this->propertiesDialog + 0x20))();
      this->propertiesDialog = (QPrintPropertiesDialog *)0x0;
    }
    if ((this->filePrintersAdded == true) && (iVar4 + -1 == index)) {
      pQVar1 = (this->widget).super_Ui_QPrintWidget.location;
      QMetaObject::tr((char *)&local_48,(char *)&QPrintDialog::staticMetaObject,0x158046);
      QLabel::setText((QString *)pQVar1);
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = (this->widget).super_Ui_QPrintWidget.type;
      QMetaObject::tr((char *)&local_48,(char *)&QPrintDialog::staticMetaObject,0x158051);
      QLabel::setText((QString *)pQVar1);
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      QWidget::setEnabled(SUB81((this->widget).super_Ui_QPrintWidget.properties,0));
      QWidget::setEnabled(SUB81((this->widget).super_Ui_QPrintWidget.filename,0));
      local_48.d.size = -0x5555555555555556;
      local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QLineEdit::text();
      QLineEdit::setText((QString *)(this->widget).super_Ui_QPrintWidget.filename);
      QWidget::setEnabled(SUB81((this->widget).super_Ui_QPrintWidget.lOutput,0));
      QPrinter::setOutputFormat(this->printer,PdfFormat);
      QPrintDevice::QPrintDevice(&local_58);
      pQVar2 = (this->m_currentPrintDevice).d.value.ptr;
      pDVar3 = (this->m_currentPrintDevice).d.d;
      (this->m_currentPrintDevice).d.value.ptr = local_58.d.value.ptr;
      (this->m_currentPrintDevice).d.d = local_58.d.d;
      local_58.d.value.ptr = pQVar2;
      local_58.d.d = pDVar3;
      QPrintDevice::~QPrintDevice(&local_58);
      if (this->optionsPane != (QPrintDialogPrivate *)0x0) {
        QPrintDialogPrivate::selectPrinter(this->optionsPane,PdfFormat);
      }
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else if (this->printer != (QPrinter *)0x0) {
      QPrinter::setOutputFormat(this->printer,NativeFormat);
      pQVar5 = QPlatformPrinterSupportPlugin::get();
      if (pQVar5 == (QPlatformPrinterSupport *)0x0) {
        QPrintDevice::QPrintDevice((QPrintDevice *)&local_48);
        pQVar2 = (this->m_currentPrintDevice).d.value.ptr;
        pDVar3 = (this->m_currentPrintDevice).d.d;
        (this->m_currentPrintDevice).d.value.ptr = (QPlatformPrintDevice *)local_48.d.d;
        (this->m_currentPrintDevice).d.d = (Data *)local_48.d.ptr;
        local_48.d.d = (Data *)pQVar2;
        local_48.d.ptr = (char16_t *)pDVar3;
        QPrintDevice::~QPrintDevice((QPrintDevice *)&local_48);
      }
      else {
        QComboBox::itemText((int)&local_48);
        (*pQVar5->_vptr_QPlatformPrinterSupport[4])(&local_58,pQVar5,&local_48);
        pQVar2 = (this->m_currentPrintDevice).d.value.ptr;
        pDVar3 = (this->m_currentPrintDevice).d.d;
        (this->m_currentPrintDevice).d.value.ptr = local_58.d.value.ptr;
        (this->m_currentPrintDevice).d.d = local_58.d.d;
        local_58.d.value.ptr = pQVar2;
        local_58.d.d = pDVar3;
        QPrintDevice::~QPrintDevice(&local_58);
        if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
          LOCK();
          *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1
          ;
          UNLOCK();
          if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      this_01 = this->printer;
      this_00 = &this->m_currentPrintDevice;
      QPrintDevice::id(&local_48,this_00);
      QPrinter::setPrinterName(this_01,&local_48);
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = (this->widget).super_Ui_QPrintWidget.location;
      QPrintDevice::location(&local_48,this_00);
      QLabel::setText((QString *)pQVar1);
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = (this->widget).super_Ui_QPrintWidget.type;
      QPrintDevice::makeAndModel(&local_48,this_00);
      QLabel::setText((QString *)pQVar1);
      if ((QPlatformPrintDevice *)local_48.d.d != (QPlatformPrintDevice *)0x0) {
        LOCK();
        *(int *)&(local_48.d.d)->super_QArrayData = *(int *)&(local_48.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_48.d.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (this->optionsPane != (QPrintDialogPrivate *)0x0) {
        QPrintDialogPrivate::selectPrinter(this->optionsPane,NativeFormat);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnixPrintWidgetPrivate::_q_printerChanged(int index)
{
    if (index < 0)
        return;
    const int printerCount = widget.printers->count();
    widget.filename->setEnabled(false);
    widget.lOutput->setEnabled(false);

    // Reset properties dialog when printer is changed
    if (propertiesDialog){
        delete propertiesDialog;
        propertiesDialog = nullptr;
    }

#if QT_CONFIG(cups)
    m_duplexPpdOption = nullptr;
#endif

    if (filePrintersAdded) {
        Q_ASSERT(index != printerCount - 2); // separator
        if (index == printerCount - 1) { // PDF
            widget.location->setText(QPrintDialog::tr("Local file"));
            widget.type->setText(QPrintDialog::tr("Write PDF file"));
            widget.properties->setEnabled(true);
            widget.filename->setEnabled(true);
            QString filename = widget.filename->text();
            widget.filename->setText(filename);
            widget.lOutput->setEnabled(true);
            printer->setOutputFormat(QPrinter::PdfFormat);
            m_currentPrintDevice = QPrintDevice();
            if (optionsPane)
                optionsPane->selectPrinter(QPrinter::PdfFormat);
            return;
        }
    }

    if (printer) {
        printer->setOutputFormat(QPrinter::NativeFormat);

        QPlatformPrinterSupport *ps = QPlatformPrinterSupportPlugin::get();
        if (ps)
            m_currentPrintDevice = ps->createPrintDevice(widget.printers->itemText(index));
        else
            m_currentPrintDevice = QPrintDevice();

        printer->setPrinterName(m_currentPrintDevice.id());

        widget.location->setText(m_currentPrintDevice.location());
        widget.type->setText(m_currentPrintDevice.makeAndModel());
        if (optionsPane)
            optionsPane->selectPrinter(QPrinter::NativeFormat);
    }

#if QT_CONFIG(cups)
    m_duplexPpdOption = QCUPSSupport::findPpdOption("Duplex", &m_currentPrintDevice);
#endif
}